

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_env_infrastructure_reuse.hpp
# Opt level: O0

disp_binding_activator_t * __thiscall
so_5::env_infrastructures::st_reusable_stuff::
default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>_>
::bind_agent(disp_binding_activator_t *__return_storage_ptr__,
            default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>_>
            *this,environment_t *param_1,agent_ref_t *agent)

{
  default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
  *this_00;
  undefined1 local_38 [8];
  anon_class_16_2_e3bdd2f0 result;
  agent_ref_t *agent_local;
  environment_t *param_2_local;
  default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>_>
  *this_local;
  
  result.this = (default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>_>
                 *)agent;
  intrusive_ptr_t<so_5::agent_t>::intrusive_ptr_t((intrusive_ptr_t<so_5::agent_t> *)local_38,agent);
  result.agent.m_obj = (agent_t *)this;
  this_00 = outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>_>
            ::get(&this->m_actual_disp);
  default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
  ::agent_bound(this_00);
  std::function<void()>::
  function<so_5::env_infrastructures::st_reusable_stuff::default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>>::bind_agent(so_5::environment_t&,so_5::intrusive_ptr_t<so_5::agent_t>)::_lambda()_1_,void>
            ((function<void()> *)__return_storage_ptr__,(anon_class_16_2_e3bdd2f0 *)local_38);
  default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>>
  ::bind_agent(so_5::environment_t&,so_5::intrusive_ptr_t<so_5::agent_t>)::{lambda()#1}::
  ~intrusive_ptr_t((_lambda___1_ *)local_38);
  return __return_storage_ptr__;
}

Assistant:

virtual disp_binding_activator_t
		bind_agent(
			environment_t & /*env*/,
			agent_ref_t agent ) override
			{
				auto result = [agent, this]() {
					agent->so_bind_to_dispatcher( m_actual_disp.get().event_queue() );
				};

				// Dispatcher must know about yet another agent bound.
				m_actual_disp.get().agent_bound();

				return result;
			}